

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_include_file(char *fname)

{
  FILE *pFVar1;
  size_t sVar2;
  size_t sVar3;
  char *in_RDI;
  char *saveptr;
  char envfiles [10000];
  char *envar;
  char *cp;
  char *p2;
  char *p;
  char local_2748 [9999];
  undefined1 local_39;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 0x16a;
  }
  else if (ngp_inclevel < 10) {
    local_10 = in_RDI;
    pFVar1 = fopen64(in_RDI,"r");
    ngp_fp[ngp_inclevel] = (FILE *)pFVar1;
    if (pFVar1 == (FILE *)0x0) {
      local_30 = getenv("CFITSIO_INCLUDE_FILES");
      if (local_30 != (char *)0x0) {
        strncpy(local_2748,local_30,9999);
        local_39 = 0;
        local_20 = strtok(local_2748,":");
        while (local_20 != (char *)0x0) {
          sVar2 = strlen(local_10);
          sVar3 = strlen(local_20);
          local_28 = (char *)malloc(sVar2 + sVar3 + 2);
          if (local_28 == (char *)0x0) {
            return 0x168;
          }
          strcpy(local_28,local_20);
          strcat(local_28,"/");
          strcat(local_28,local_10);
          pFVar1 = fopen64(local_28,"r");
          ngp_fp[ngp_inclevel] = (FILE *)pFVar1;
          free(local_28);
          if (ngp_fp[ngp_inclevel] != (FILE *)0x0) break;
          local_20 = strtok((char *)0x0,":");
        }
      }
      if (ngp_fp[ngp_inclevel] == (FILE *)0x0) {
        if (*local_10 == '/') {
          return 0x16e;
        }
        if (ngp_master_dir[0] == '\0') {
          return 0x16e;
        }
        sVar2 = strlen(local_10);
        sVar3 = strlen(ngp_master_dir);
        local_18 = (char *)malloc(sVar2 + sVar3 + 1);
        if (local_18 == (char *)0x0) {
          return 0x168;
        }
        strcpy(local_18,ngp_master_dir);
        strcat(local_18,local_10);
        pFVar1 = fopen64(local_18,"r");
        ngp_fp[ngp_inclevel] = (FILE *)pFVar1;
        free(local_18);
        if (ngp_fp[ngp_inclevel] == (FILE *)0x0) {
          return 0x16e;
        }
      }
    }
    ngp_inclevel = ngp_inclevel + 1;
    local_4 = 0;
  }
  else {
    local_4 = 0x16d;
  }
  return local_4;
}

Assistant:

int	ngp_include_file(char *fname)		/* try to open include file */
 { char *p, *p2, *cp, *envar, envfiles[NGP_MAX_ENVFILES];
   char *saveptr;

   if (NULL == fname) return(NGP_NUL_PTR);

   if (ngp_inclevel >= NGP_MAX_INCLUDE)		/* too many include files */
     return(NGP_INC_NESTING);

   if (NULL == (ngp_fp[ngp_inclevel] = fopen(fname, "r")))
     {                                          /* if simple open failed .. */
       envar = getenv("CFITSIO_INCLUDE_FILES");	/* scan env. variable, and retry to open */

       if (NULL != envar)			/* is env. variable defined ? */
         { strncpy(envfiles, envar, NGP_MAX_ENVFILES - 1);
           envfiles[NGP_MAX_ENVFILES - 1] = 0;	/* copy search path to local variable, env. is fragile */

           for (p2 = ffstrtok(envfiles, ":",&saveptr); NULL != p2; p2 = ffstrtok(NULL, ":",&saveptr))
            {
	      cp = (char *)ngp_alloc(strlen(fname) + strlen(p2) + 2);
	      if (NULL == cp) return(NGP_NO_MEMORY);

	      strcpy(cp, p2);
#ifdef  MSDOS
              strcat(cp, "\\");			/* abs. pathname for MSDOS */
               
#else
              strcat(cp, "/");			/* and for unix */
#endif
	      strcat(cp, fname);
	  
	      ngp_fp[ngp_inclevel] = fopen(cp, "r");
	      ngp_free(cp);

	      if (NULL != ngp_fp[ngp_inclevel]) break;
	    }
        }
                                      
       if (NULL == ngp_fp[ngp_inclevel])	/* finally try to open relative to top level */
         {
#ifdef  MSDOS
           if ('\\' == fname[0]) return(NGP_ERR_FOPEN); /* abs. pathname for MSDOS, does not support C:\\PATH */
#else
           if ('/' == fname[0]) return(NGP_ERR_FOPEN); /* and for unix */
#endif
           if (0 == ngp_master_dir[0]) return(NGP_ERR_FOPEN);

	   p = ngp_alloc(strlen(fname) + strlen(ngp_master_dir) + 1);
           if (NULL == p) return(NGP_NO_MEMORY);

           strcpy(p, ngp_master_dir);		/* construct composite pathname */
           strcat(p, fname);			/* comp = master + fname */

           ngp_fp[ngp_inclevel] = fopen(p, "r");/* try to open composite */
           ngp_free(p);				/* we don't need buffer anymore */

           if (NULL == ngp_fp[ngp_inclevel])
             return(NGP_ERR_FOPEN);		/* fail if error */
         }
     }

   ngp_inclevel++;
   return(NGP_OK);
 }